

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmResourceInfoCommon.h
# Opt level: O1

uint8_t __thiscall
GmmLib::GmmResourceInfoCommon::GetSetHardwareProtection
          (GmmResourceInfoCommon *this,uint8_t GetIsEncrypted,uint8_t SetIsEncrypted)

{
  anon_struct_8_44_94931171_for_Info aVar1;
  undefined3 in_register_00000031;
  
  aVar1 = (this->Surf).Flags.Info;
  if (CONCAT31(in_register_00000031,GetIsEncrypted) == 0) {
    (this->Surf).Flags.Info =
         (anon_struct_8_44_94931171_for_Info)
         ((ulong)aVar1 & 0xffffffffffffdfff | (ulong)(SetIsEncrypted & 1) << 0xd);
  }
  else {
    SetIsEncrypted = (byte)((ulong)aVar1 >> 0xd) & 1;
  }
  return SetIsEncrypted;
}

Assistant:

virtual GMM_INLINE_EXPORTED uint8_t GMM_STDCALL GetSetHardwareProtection(uint8_t GetIsEncrypted, uint8_t SetIsEncrypted)
            {
                uint8_t IsEncrypted = 0;

                if (GetIsEncrypted)
                {
                    IsEncrypted = Surf.Flags.Info.HardwareProtected;
                }
                else
                {
                    Surf.Flags.Info.HardwareProtected = IsEncrypted = SetIsEncrypted;
                }

                return IsEncrypted;
            }